

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizerLocal::ChOptimizerLocal(ChOptimizerLocal *this)

{
  (this->super_ChOptimizer).err_message[0] = '\0';
  (this->super_ChOptimizer).error_code = 0;
  (this->super_ChOptimizer).C_vars = 0;
  (this->super_ChOptimizer).afunction = (ChFx *)0x0;
  (this->super_ChOptimizer).afunctionGrad = (ChFx *)0x0;
  (this->super_ChOptimizer).xv = (double *)0x0;
  (this->super_ChOptimizer).xv_sup = (double *)0x0;
  *(undefined8 *)((long)&(this->super_ChOptimizer).xv_sup + 1) = 0;
  *(undefined8 *)((long)&(this->super_ChOptimizer).xv_inf + 1) = 0;
  (this->super_ChOptimizer).fx_evaluations = 0;
  (this->super_ChOptimizer).grad_evaluations = 0;
  (this->super_ChOptimizer).grad_step = 1e-12;
  (this->super_ChOptimizer).opt_fx = 0.0;
  (this->super_ChOptimizer).break_funct = (_func_int *)0x0;
  (this->super_ChOptimizer).break_cycles = 10;
  (this->super_ChOptimizer).user_break = 0;
  (this->super_ChOptimizer).break_cyclecounter = 0;
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizer_00b3a9a0;
  this->initial_step = 1.0;
  this->arg_tol = 1e-06;
  this->fun_tol = 1e-07;
  this->maxiters = 0x32;
  this->maxevaluations = 200;
  this->gamma = 2.001;
  this->dilation = 2.5;
  this->gradstep = 1e-100;
  this->iters_done = 0;
  return;
}

Assistant:

ChOptimizer::ChOptimizer() {
    strcpy(err_message, "");
    C_vars = 0;
    afunction = 0;
    afunctionGrad = 0;

    xv = NULL;
    xv_sup = NULL;
    xv_inf = NULL;

    minimize = false;
    opt_fx = 0;
    error_code = 0;
    fx_evaluations = 0;
    grad_evaluations = 0;
    grad_step = 1.e-12;

    break_funct = NULL;
    break_cycles = 10;
    break_cyclecounter = 0;
    user_break = 0;
}